

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int32_t ffi_checkint(lua_State *L,int narg)

{
  CTState *cts;
  int32_t i;
  int32_t local_c;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  if (L->base + ((ulong)(uint)narg - 1) < L->top) {
    lj_cconv_ct_tv(cts,cts->tab + 9,(uint8_t *)&local_c,L->base + ((ulong)(uint)narg - 1),narg << 8)
    ;
    return local_c;
  }
  lj_err_arg(L,narg,LJ_ERR_NOVAL);
}

Assistant:

static int32_t ffi_checkint(lua_State *L, int narg)
{
  CTState *cts = ctype_cts(L);
  TValue *o = L->base + narg-1;
  int32_t i;
  if (o >= L->top)
    lj_err_arg(L, narg, LJ_ERR_NOVAL);
  lj_cconv_ct_tv(cts, ctype_get(cts, CTID_INT32), (uint8_t *)&i, o,
		 CCF_ARG(narg));
  return i;
}